

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

int ipc_helper_send_zero(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  uv_buf_t local_18;
  
  local_18 = uv_buf_init((char *)0x0,0);
  puVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar2,&channel,0);
  if (iVar1 == 0) {
    uv_pipe_open(&channel,0);
    iVar1 = uv_is_readable((uv_stream_t *)&channel);
    if (iVar1 == 1) {
      iVar1 = uv_is_writable((uv_stream_t *)&channel);
      if (iVar1 == 1) {
        iVar1 = uv_is_closing((uv_handle_t *)&channel);
        if (iVar1 == 0) {
          iVar1 = uv_write(&write_req,(uv_stream_t *)&channel,&local_18,1,send_zero_write_cb);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            if (iVar1 == 0) {
              if (send_zero_write == 1) {
                puVar2 = uv_default_loop();
                close_loop(puVar2);
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_close(puVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                uVar3 = 0x3cc;
              }
              else {
                pcVar4 = "send_zero_write == 1";
                uVar3 = 0x3ca;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0x3c8;
            }
          }
          else {
            pcVar4 = "r == 0";
            uVar3 = 0x3c5;
          }
        }
        else {
          pcVar4 = "0 == uv_is_closing((uv_handle_t*) &channel)";
          uVar3 = 0x3bd;
        }
      }
      else {
        pcVar4 = "1 == uv_is_writable((uv_stream_t*) &channel)";
        uVar3 = 0x3bc;
      }
    }
    else {
      pcVar4 = "1 == uv_is_readable((uv_stream_t*) &channel)";
      uVar3 = 0x3bb;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x3b7;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

int ipc_helper_send_zero(void) {
  int r;
  uv_buf_t zero_buf;

  zero_buf = uv_buf_init(0, 0);

  r = uv_pipe_init(uv_default_loop(), &channel, 0);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  r = uv_write(&write_req,
               (uv_stream_t*)&channel,
               &zero_buf,
               1,
               send_zero_write_cb);

  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(send_zero_write == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}